

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

parser_error parse_object_base_flags(parser *p)

{
  long lVar1;
  _Bool _Var2;
  errr eVar3;
  errr eVar4;
  void *pvVar5;
  char *pcVar6;
  char *flag_name;
  parser_error pVar7;
  
  pvVar5 = parser_priv(p);
  if (pvVar5 == (void *)0x0) {
    __assert_fail("d",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/obj-init.c"
                  ,0x242,"enum parser_error parse_object_base_flags(struct parser *)");
  }
  lVar1 = *(long *)((long)pvVar5 + 0x98);
  if (lVar1 == 0) {
    pVar7 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pcVar6 = parser_getstr(p,"flags");
    pcVar6 = string_make(pcVar6);
    flag_name = strtok(pcVar6," |");
    while (flag_name != (char *)0x0) {
      eVar3 = grab_flag((bitflag *)(lVar1 + 0x1c),5,obj_flags,flag_name);
      eVar4 = grab_flag((bitflag *)(lVar1 + 0x21),2,kind_flags,flag_name);
      _Var2 = grab_element_flag((element_info *)(lVar1 + 0x24),flag_name);
      if (((!_Var2) && (eVar4 != 0)) && (eVar3 != 0)) {
        pVar7 = PARSE_ERROR_INVALID_FLAG;
        goto LAB_0017e570;
      }
      flag_name = strtok((char *)0x0," |");
    }
    pVar7 = PARSE_ERROR_NONE;
LAB_0017e570:
    string_free(pcVar6);
  }
  return pVar7;
}

Assistant:

static enum parser_error parse_object_base_flags(struct parser *p) {
	struct object_base *kb;
	char *s, *t;
	struct kb_parsedata *d = parser_priv(p);

	assert(d);
	kb = d->kb;
	if (!kb) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	s = string_make(parser_getstr(p, "flags"));
	t = strtok(s, " |");
	while (t) {
		bool found = false;
		if (!grab_flag(kb->flags, OF_SIZE, obj_flags, t)) {
			found = true;
		}
		if (!grab_flag(kb->kind_flags, KF_SIZE, kind_flags, t)) {
			found = true;
		}
		if (grab_element_flag(kb->el_info, t)) {
			found = true;
		}
		if (!found) {
			break;
		}
		t = strtok(NULL, " |");
	}
	string_free(s);
	return t ? PARSE_ERROR_INVALID_FLAG : PARSE_ERROR_NONE;
}